

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

Promise<kj::Maybe<capnp::MessageReaderAndFds>_>
capnp::tryReadMessage
          (AsyncCapabilityStream *input,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  word *pwVar3;
  size_t in_R9;
  SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
  *location;
  ArrayPtr<capnp::word> scratchSpace_00;
  void *continuationTracePtr;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  undefined1 local_88 [16];
  code *local_78;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> local_70;
  anon_class_32_2_fe89d4e7_for_func local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  ReaderOptions local_38;
  
  local_38.traversalLimitInWords = options._8_8_;
  pwVar3 = (word *)options.traversalLimitInWords;
  local_38.nestingLimit = (int)in_R9;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((kj *)&local_70,&local_38);
  scratchSpace_00.size_ = in_R9;
  scratchSpace_00.ptr = pwVar3;
  anon_unknown_0::AsyncMessageReader::readWithFds
            ((AsyncMessageReader *)local_88,(AsyncCapabilityStream *)local_70.ptr,fdSpace,
             scratchSpace_00);
  local_60.reader.disposer = local_70.disposer;
  local_60.reader.ptr = local_70.ptr;
  local_70.ptr = (AsyncMessageReader *)0x0;
  local_78 = kj::_::
             SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
             ::anon_class_32_2_fe89d4e7_for_func::operator();
  pPVar1 = ((PromiseArenaMember *)local_88._0_8_)->arena;
  local_60.fdSpace.ptr = (OwnFd *)fdSpace.size_;
  local_60.fdSpace.size_ = (size_t)pwVar3;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_88._0_8_ - (long)pPVar1) < 0x40) {
    pvVar2 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
                *)((long)pvVar2 + 0x3c0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88,&local_60,
               &local_78);
    *(void **)((long)pvVar2 + 0x3c8) = pvVar2;
  }
  else {
    ((PromiseArenaMember *)local_88._0_8_)->arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
                *)(local_88._0_8_ + -0x40);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88,&local_60,
               &local_78);
    (((PromiseNode *)(local_88._0_8_ + -0x40))->super_PromiseArenaMember).arena = pPVar1;
  }
  local_88._8_8_ = 0;
  (input->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)location;
  local_40.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_88 + 8));
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own(&local_60.reader);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_88);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own(&local_70);
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> tryReadMessage(
    kj::AsyncCapabilityStream& input, kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->readWithFds(input, fdSpace, scratchSpace);
  return promise.then([reader = kj::mv(reader), fdSpace](kj::Maybe<size_t> nfds) mutable
                      -> kj::Maybe<MessageReaderAndFds> {
    KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    } else {
      return kj::none;
    }
  });
}